

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_tests.cpp
# Opt level: O1

void __thiscall blockfilter_tests::blockfilter_basic_test::test_method(blockfilter_basic_test *this)

{
  vector<CTxOut,_std::allocator<CTxOut>_> *pvVar1;
  long lVar2;
  uint uVar3;
  size_type sVar4;
  CScript scriptPubKeyIn;
  CScript scriptPubKeyIn_00;
  CScript scriptPubKeyIn_01;
  void *pvVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  pointer pCVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  bool bVar21;
  uint uVar22;
  int iVar23;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar24;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar25;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar26;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar27;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar28;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar29;
  undefined8 uVar30;
  const_iterator cVar31;
  iterator in_R8;
  iterator pvVar32;
  iterator in_R9;
  iterator pvVar33;
  long lVar34;
  long in_FS_OFFSET;
  readonly_property<bool> rVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  check_type cVar40;
  undefined8 in_stack_fffffffffffff988;
  undefined8 in_stack_fffffffffffff990;
  undefined8 in_stack_fffffffffffff998;
  undefined8 in_stack_fffffffffffff9a0;
  char *local_650;
  char *local_648;
  undefined1 *local_640;
  undefined1 *local_638;
  char *local_630;
  char *local_628;
  BlockFilterType local_61a;
  undefined1 local_619;
  undefined1 local_618 [16];
  undefined1 *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  undefined1 local_568 [32];
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  CBlockUndo block_undo;
  CMutableTransaction tx_2;
  CMutableTransaction tx_1;
  undefined1 local_458 [8];
  assertion_result local_450;
  undefined1 *local_438;
  undefined1 local_430 [8];
  undefined1 local_428 [20];
  uint32_t uStack_414;
  lazy_ostream *local_410;
  uint256 *local_400;
  char *local_3f8;
  assertion_result local_3f0;
  BlockFilter default_ctor_block_filter_2;
  BlockFilter default_ctor_block_filter_1;
  BlockFilter block_filter2;
  BlockFilter block_filter;
  direct_or_indirect local_228;
  uint local_20c;
  direct_or_indirect local_208;
  uint local_1ec;
  direct_or_indirect local_1e8;
  uint local_1cc;
  CBlock block;
  CScript excluded_scripts [4];
  CScript included_scripts [5];
  
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ =
       block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  memset(included_scripts,0,0xa0);
  excluded_scripts[3].super_CScriptBase._16_16_ = (undefined1  [16])0x0;
  excluded_scripts[3].super_CScriptBase._union._0_16_ = (undefined1  [16])0x0;
  excluded_scripts[2].super_CScriptBase._16_16_ = (undefined1  [16])0x0;
  excluded_scripts[2].super_CScriptBase._union._0_16_ = (undefined1  [16])0x0;
  excluded_scripts[1].super_CScriptBase._16_16_ = (undefined1  [16])0x0;
  excluded_scripts[1].super_CScriptBase._union._0_16_ = (undefined1  [16])0x0;
  excluded_scripts[0].super_CScriptBase._16_16_ = (undefined1  [16])0x0;
  excluded_scripts[0].super_CScriptBase._union._0_16_ = (undefined1  [16])0x0;
  block.super_CBlockHeader.nVersion = 0;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  auVar11._8_8_ = 0;
  auVar11[0] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14];
  auVar11[1] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15];
  auVar11[2] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16];
  auVar11[3] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17];
  auVar11[4] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18];
  auVar11[5] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19];
  auVar11[6] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a];
  auVar11[7] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b];
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_16_ =
       auVar11 << 0x40;
  ppVar24 = &CScript::operator<<(included_scripts,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&block)->
             super_CScriptBase;
  uVar22 = ppVar24->_size;
  uVar3 = uVar22 - 0x1d;
  if (uVar22 < 0x1d) {
    uVar3 = uVar22;
  }
  ppVar25 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar24->_union).indirect_contents.indirect;
  if (uVar22 < 0x1d) {
    ppVar25 = ppVar24;
  }
  block_filter.m_filter_type = 0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar24,(uchar *)((long)&ppVar25->_union + (long)(int)uVar3),
             &block_filter.m_filter_type);
  if (block.super_CBlockHeader._0_8_ != 0) {
    operator_delete((void *)block.super_CBlockHeader._0_8_,
                    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                    _12_8_ - block.super_CBlockHeader._0_8_);
  }
  ppVar24 = &included_scripts[1].super_CScriptBase;
  uVar30 = included_scripts[1].super_CScriptBase._union.indirect_contents.indirect;
  sVar4 = included_scripts[1].super_CScriptBase._size - 0x1d;
  if (included_scripts[1].super_CScriptBase._size < 0x1d) {
    uVar30 = ppVar24;
    sVar4 = included_scripts[1].super_CScriptBase._size;
  }
  block.super_CBlockHeader.nVersion._0_1_ = 0x76;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar24,(uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar30)->
                                      _union + (long)(int)sVar4),(uchar *)&block);
  sVar4 = included_scripts[1].super_CScriptBase._size - 0x1d;
  if (included_scripts[1].super_CScriptBase._size < 0x1d) {
    included_scripts[1].super_CScriptBase._union._0_8_ = ppVar24;
    sVar4 = included_scripts[1].super_CScriptBase._size;
  }
  block.super_CBlockHeader.nVersion._0_1_ = 0xa9;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar24,(uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                      included_scripts[1].super_CScriptBase._union._0_8_)->_union +
                              (long)(int)sVar4),(uchar *)&block);
  block.super_CBlockHeader.nVersion = 0;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  auVar6._8_8_ = 0;
  auVar6[0] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14];
  auVar6[1] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15];
  auVar6[2] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16];
  auVar6[3] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17];
  auVar6[4] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18];
  auVar6[5] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19];
  auVar6[6] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a];
  auVar6[7] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b];
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_16_ =
       auVar6 << 0x40;
  block.super_CBlockHeader._0_8_ = operator_new(1);
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       (undefined1 *)(block.super_CBlockHeader._0_8_ + 1);
  *(undefined1 *)block.super_CBlockHeader._0_8_ = 0x14;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ =
       (undefined1 *)(block.super_CBlockHeader._0_8_ + 1);
  ppVar25 = &CScript::operator<<((CScript *)ppVar24,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&block)->
             super_CScriptBase;
  uVar22 = ppVar25->_size;
  uVar3 = uVar22 - 0x1d;
  if (uVar22 < 0x1d) {
    uVar3 = uVar22;
  }
  ppVar26 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar25->_union).indirect_contents.indirect;
  if (uVar22 < 0x1d) {
    ppVar26 = ppVar25;
  }
  block_filter.m_filter_type = 0x88;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar25,(uchar *)((long)&ppVar26->_union + (long)(int)uVar3),
             &block_filter.m_filter_type);
  uVar22 = ppVar25->_size;
  uVar3 = uVar22 - 0x1d;
  if (uVar22 < 0x1d) {
    uVar3 = uVar22;
  }
  ppVar26 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar25->_union).indirect_contents.indirect;
  if (uVar22 < 0x1d) {
    ppVar26 = ppVar25;
  }
  block_filter.m_filter_type = 0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar25,(uchar *)((long)&ppVar26->_union + (long)(int)uVar3),
             &block_filter.m_filter_type);
  if (block.super_CBlockHeader._0_8_ != 0) {
    operator_delete((void *)block.super_CBlockHeader._0_8_,
                    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                    _12_8_ - block.super_CBlockHeader._0_8_);
  }
  ppVar25 = &included_scripts[2].super_CScriptBase;
  sVar4 = included_scripts[2].super_CScriptBase._size - 0x1d;
  if (included_scripts[2].super_CScriptBase._size < 0x1d) {
    included_scripts[2].super_CScriptBase._union._0_8_ = ppVar25;
    sVar4 = included_scripts[2].super_CScriptBase._size;
  }
  block.super_CBlockHeader.nVersion._0_1_ = 0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar25,(uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                      included_scripts[2].super_CScriptBase._union._0_8_)->_union +
                              (long)(int)sVar4),(uchar *)&block);
  block.super_CBlockHeader.nVersion = 0;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  auVar7._8_8_ = 0;
  auVar7[0] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14];
  auVar7[1] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15];
  auVar7[2] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16];
  auVar7[3] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17];
  auVar7[4] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18];
  auVar7[5] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19];
  auVar7[6] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a];
  auVar7[7] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b];
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_16_ =
       auVar7 << 0x40;
  block.super_CBlockHeader._0_8_ = operator_new(2);
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       (undefined2 *)(block.super_CBlockHeader._0_8_ + 2);
  *(undefined2 *)block.super_CBlockHeader._0_8_ = 0x2121;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ =
       (undefined2 *)(block.super_CBlockHeader._0_8_ + 2);
  ppVar26 = &CScript::operator<<((CScript *)ppVar25,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&block)->
             super_CScriptBase;
  uVar22 = ppVar26->_size;
  uVar3 = uVar22 - 0x1d;
  if (uVar22 < 0x1d) {
    uVar3 = uVar22;
  }
  ppVar28 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar26->_union).indirect_contents.indirect;
  if (uVar22 < 0x1d) {
    ppVar28 = ppVar26;
  }
  block_filter.m_filter_type = 0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar26,(uchar *)((long)&ppVar28->_union + (long)(int)uVar3),
             &block_filter.m_filter_type);
  uVar22 = ppVar26->_size;
  uVar3 = uVar22 - 0x1d;
  if (uVar22 < 0x1d) {
    uVar3 = uVar22;
  }
  ppVar28 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar26->_union).indirect_contents.indirect;
  if (uVar22 < 0x1d) {
    ppVar28 = ppVar26;
  }
  block_filter.m_filter_type = 0xae;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar26,(uchar *)((long)&ppVar28->_union + (long)(int)uVar3),
             &block_filter.m_filter_type);
  if (block.super_CBlockHeader._0_8_ != 0) {
    operator_delete((void *)block.super_CBlockHeader._0_8_,
                    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                    _12_8_ - block.super_CBlockHeader._0_8_);
  }
  ppVar26 = &included_scripts[3].super_CScriptBase;
  sVar4 = included_scripts[3].super_CScriptBase._size - 0x1d;
  if (included_scripts[3].super_CScriptBase._size < 0x1d) {
    included_scripts[3].super_CScriptBase._union._0_8_ = ppVar26;
    sVar4 = included_scripts[3].super_CScriptBase._size;
  }
  auVar8[0xf] = 0;
  auVar8._0_15_ = (undefined1  [15])block.super_CBlockHeader._1_15_;
  block.super_CBlockHeader._0_16_ = auVar8 << 8;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar26,(uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                      included_scripts[3].super_CScriptBase._union._0_8_)->_union +
                              (long)(int)sVar4),(uchar *)&block);
  block.super_CBlockHeader.nVersion = 0;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  auVar9._8_8_ = 0;
  auVar9[0] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14];
  auVar9[1] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15];
  auVar9[2] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16];
  auVar9[3] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17];
  auVar9[4] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18];
  auVar9[5] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19];
  auVar9[6] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a];
  auVar9[7] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b];
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_16_ =
       auVar9 << 0x40;
  block.super_CBlockHeader._0_8_ = operator_new(3);
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       block.super_CBlockHeader._0_8_ + 3;
  *(undefined1 *)(block.super_CBlockHeader._0_8_ + 2) = 0x20;
  *(undefined2 *)block.super_CBlockHeader._0_8_ = 0x2020;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ =
       block.super_CBlockHeader._0_8_ + 3;
  CScript::operator<<((CScript *)ppVar26,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&block);
  if (block.super_CBlockHeader._0_8_ != 0) {
    operator_delete((void *)block.super_CBlockHeader._0_8_,
                    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                    _12_8_ - block.super_CBlockHeader._0_8_);
  }
  ppVar28 = &included_scripts[4].super_CScriptBase;
  uVar30 = included_scripts[4].super_CScriptBase._union.indirect_contents.indirect;
  sVar4 = included_scripts[4].super_CScriptBase._size - 0x1d;
  if (included_scripts[4].super_CScriptBase._size < 0x1d) {
    uVar30 = ppVar28;
    sVar4 = included_scripts[4].super_CScriptBase._size;
  }
  block.super_CBlockHeader.nVersion._0_1_ = 0x54;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar28,(uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar30)->
                                      _union + (long)(int)sVar4),(uchar *)&block);
  uVar30 = included_scripts[4].super_CScriptBase._union.indirect_contents.indirect;
  sVar4 = included_scripts[4].super_CScriptBase._size - 0x1d;
  if (included_scripts[4].super_CScriptBase._size < 0x1d) {
    uVar30 = ppVar28;
    sVar4 = included_scripts[4].super_CScriptBase._size;
  }
  block.super_CBlockHeader.nVersion._0_1_ = 0x93;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar28,(uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar30)->
                                      _union + (long)(int)sVar4),(uchar *)&block);
  uVar30 = included_scripts[4].super_CScriptBase._union.indirect_contents.indirect;
  sVar4 = included_scripts[4].super_CScriptBase._size - 0x1d;
  if (included_scripts[4].super_CScriptBase._size < 0x1d) {
    uVar30 = ppVar28;
    sVar4 = included_scripts[4].super_CScriptBase._size;
  }
  block.super_CBlockHeader.nVersion._0_1_ = 0x58;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar28,(uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar30)->
                                      _union + (long)(int)sVar4),(uchar *)&block);
  sVar4 = included_scripts[4].super_CScriptBase._size - 0x1d;
  if (included_scripts[4].super_CScriptBase._size < 0x1d) {
    included_scripts[4].super_CScriptBase._union._0_8_ = ppVar28;
    sVar4 = included_scripts[4].super_CScriptBase._size;
  }
  block.super_CBlockHeader.nVersion._0_1_ = 0x87;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar28,(uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                      included_scripts[4].super_CScriptBase._union._0_8_)->_union +
                              (long)(int)sVar4),(uchar *)&block);
  sVar4 = excluded_scripts[0].super_CScriptBase._size - 0x1d;
  if (excluded_scripts[0].super_CScriptBase._size < 0x1d) {
    sVar4 = excluded_scripts[0].super_CScriptBase._size;
  }
  uVar30 = excluded_scripts[0].super_CScriptBase._union.indirect_contents.indirect;
  if (excluded_scripts[0].super_CScriptBase._size < 0x1d) {
    uVar30 = &excluded_scripts[0].super_CScriptBase;
  }
  block.super_CBlockHeader.nVersion._0_1_ = 0x6a;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&excluded_scripts[0].super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar30)->_union +
                      (long)(int)sVar4),(uchar *)&block);
  block.super_CBlockHeader.nVersion = 0;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  auVar10._8_8_ = 0;
  auVar10[0] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14];
  auVar10[1] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15];
  auVar10[2] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16];
  auVar10[3] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17];
  auVar10[4] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18];
  auVar10[5] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19];
  auVar10[6] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a];
  auVar10[7] = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b];
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_16_ =
       auVar10 << 0x40;
  block.super_CBlockHeader._0_8_ = operator_new(4);
  *(undefined4 *)block.super_CBlockHeader._0_8_ = 0x28282828;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ =
       (undefined4 *)(block.super_CBlockHeader._0_8_ + 4);
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       (undefined4 *)(block.super_CBlockHeader._0_8_ + 4);
  CScript::operator<<(excluded_scripts,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&block);
  if (block.super_CBlockHeader._0_8_ != 0) {
    operator_delete((void *)block.super_CBlockHeader._0_8_,
                    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                    _12_8_ - block.super_CBlockHeader._0_8_);
  }
  block.super_CBlockHeader.nVersion = 0;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block.super_CBlockHeader._0_8_ = operator_new(5);
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       block.super_CBlockHeader._0_8_ + 5;
  *(undefined1 *)(block.super_CBlockHeader._0_8_ + 4) = 0x21;
  *(undefined4 *)block.super_CBlockHeader._0_8_ = 0x21212121;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ =
       block.super_CBlockHeader._0_8_ + 5;
  ppVar27 = &CScript::operator<<(excluded_scripts + 1,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&block)->
             super_CScriptBase;
  uVar22 = ppVar27->_size;
  uVar3 = uVar22 - 0x1d;
  if (uVar22 < 0x1d) {
    uVar3 = uVar22;
  }
  ppVar29 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar27->_union).indirect_contents.indirect;
  if (uVar22 < 0x1d) {
    ppVar29 = ppVar27;
  }
  block_filter.m_filter_type = 0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar27,(uchar *)((long)&ppVar29->_union + (long)(int)uVar3),
             &block_filter.m_filter_type);
  if (block.super_CBlockHeader._0_8_ != 0) {
    operator_delete((void *)block.super_CBlockHeader._0_8_,
                    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                    _12_8_ - block.super_CBlockHeader._0_8_);
  }
  ppVar27 = &excluded_scripts[2].super_CScriptBase;
  sVar4 = excluded_scripts[2].super_CScriptBase._size - 0x1d;
  if (excluded_scripts[2].super_CScriptBase._size < 0x1d) {
    sVar4 = excluded_scripts[2].super_CScriptBase._size;
  }
  uVar30 = excluded_scripts[2].super_CScriptBase._union.indirect_contents.indirect;
  if (excluded_scripts[2].super_CScriptBase._size < 0x1d) {
    uVar30 = ppVar27;
  }
  block.super_CBlockHeader.nVersion._0_1_ = 0x6a;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar27,(uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar30)->
                                      _union + (long)(int)sVar4),(uchar *)&block);
  sVar4 = excluded_scripts[2].super_CScriptBase._size - 0x1d;
  if (excluded_scripts[2].super_CScriptBase._size < 0x1d) {
    sVar4 = excluded_scripts[2].super_CScriptBase._size;
  }
  uVar30 = excluded_scripts[2].super_CScriptBase._union.indirect_contents.indirect;
  if (excluded_scripts[2].super_CScriptBase._size < 0x1d) {
    uVar30 = ppVar27;
  }
  block.super_CBlockHeader.nVersion._0_1_ = 0x54;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar27,(uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar30)->
                                      _union + (long)(int)sVar4),(uchar *)&block);
  sVar4 = excluded_scripts[2].super_CScriptBase._size - 0x1d;
  if (excluded_scripts[2].super_CScriptBase._size < 0x1d) {
    sVar4 = excluded_scripts[2].super_CScriptBase._size;
  }
  uVar30 = excluded_scripts[2].super_CScriptBase._union.indirect_contents.indirect;
  if (excluded_scripts[2].super_CScriptBase._size < 0x1d) {
    uVar30 = ppVar27;
  }
  block.super_CBlockHeader.nVersion._0_1_ = 0x93;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar27,(uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar30)->
                                      _union + (long)(int)sVar4),(uchar *)&block);
  sVar4 = excluded_scripts[2].super_CScriptBase._size - 0x1d;
  if (excluded_scripts[2].super_CScriptBase._size < 0x1d) {
    sVar4 = excluded_scripts[2].super_CScriptBase._size;
  }
  uVar30 = excluded_scripts[2].super_CScriptBase._union.indirect_contents.indirect;
  if (excluded_scripts[2].super_CScriptBase._size < 0x1d) {
    uVar30 = ppVar27;
  }
  block.super_CBlockHeader.nVersion._0_1_ = 0x58;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar27,(uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar30)->
                                      _union + (long)(int)sVar4),(uchar *)&block);
  sVar4 = excluded_scripts[2].super_CScriptBase._size - 0x1d;
  if (excluded_scripts[2].super_CScriptBase._size < 0x1d) {
    sVar4 = excluded_scripts[2].super_CScriptBase._size;
  }
  uVar30 = excluded_scripts[2].super_CScriptBase._union.indirect_contents.indirect;
  if (excluded_scripts[2].super_CScriptBase._size < 0x1d) {
    uVar30 = ppVar27;
  }
  block.super_CBlockHeader.nVersion._0_1_ = 0x87;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar27,(uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar30)->
                                      _union + (long)(int)sVar4),(uchar *)&block);
  CMutableTransaction::CMutableTransaction(&tx_1);
  pvVar1 = &tx_1.vout;
  block.super_CBlockHeader.nVersion = 100;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)pvVar1,(int *)&block,included_scripts);
  block.super_CBlockHeader.nVersion = 200;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)pvVar1,(int *)&block,(CScript *)ppVar24);
  block.super_CBlockHeader.nVersion = 0;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)pvVar1,(int *)&block,excluded_scripts);
  CMutableTransaction::CMutableTransaction(&tx_2);
  pvVar1 = &tx_2.vout;
  block.super_CBlockHeader.nVersion = 300;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)pvVar1,(int *)&block,(CScript *)ppVar25);
  block.super_CBlockHeader.nVersion = 0;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)pvVar1,(int *)&block,(CScript *)ppVar27);
  block.super_CBlockHeader.nVersion = 400;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)pvVar1,(int *)&block,
             (CScript *)&excluded_scripts[3].super_CScriptBase);
  block.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  block.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  block.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  block.super_CBlockHeader.nTime = 0;
  block.super_CBlockHeader.nBits = 0;
  block.super_CBlockHeader.nNonce = 0;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  block.super_CBlockHeader.nVersion = 0;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block.fChecked = false;
  block.m_checked_witness_commitment = false;
  block.m_checked_merkle_root = false;
  block_filter.m_filter_type = BASIC;
  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems + 7),
             (CTransaction **)&block_filter,(allocator<CTransaction> *)&block_filter2,&tx_1);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&block.vtx,(shared_ptr<const_CTransaction> *)&block_filter);
  if (block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems._7_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems._7_8_);
  }
  block_filter.m_filter_type = BASIC;
  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems + 7),
             (CTransaction **)&block_filter,(allocator<CTransaction> *)&block_filter2,&tx_2);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&block.vtx,(shared_ptr<const_CTransaction> *)&block_filter);
  if (block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems._7_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems._7_8_);
  }
  block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::_M_realloc_insert<>
            (&block_undo.vtxundo,(iterator)0x0);
  pCVar12 = block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
            super__Vector_impl_data._M_finish;
  block_filter2.m_filter_type = 0xf4;
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_1e8.indirect_contents,
             ppVar26);
  scriptPubKeyIn.super_CScriptBase._union._8_8_ = in_stack_fffffffffffff990;
  scriptPubKeyIn.super_CScriptBase._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffff988;
  scriptPubKeyIn.super_CScriptBase._union._16_8_ = in_stack_fffffffffffff998;
  scriptPubKeyIn.super_CScriptBase._24_8_ = in_stack_fffffffffffff9a0;
  CTxOut::CTxOut((CTxOut *)&block_filter,(CAmount *)&block_filter2,scriptPubKeyIn);
  default_ctor_block_filter_1.m_filter_type = 0xe8;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\x03';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  default_ctor_block_filter_2.m_filter_type = 1;
  std::vector<Coin,std::allocator<Coin>>::emplace_back<CTxOut,int,bool>
            ((vector<Coin,std::allocator<Coin>> *)(pCVar12 + -1),(CTxOut *)&block_filter,
             (int *)&default_ctor_block_filter_1,(bool *)&default_ctor_block_filter_2);
  if (0x1c < (uint)block_filter._36_4_) {
    free((void *)block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems._7_8_);
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  }
  if (0x1c < local_1cc) {
    free(local_1e8.indirect_contents.indirect);
    local_1e8.indirect_contents.indirect = (char *)0x0;
  }
  pCVar12 = block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
            super__Vector_impl_data._M_finish;
  block_filter2.m_filter_type = 0x58;
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\x02';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_208.indirect_contents,
             ppVar28);
  scriptPubKeyIn_00.super_CScriptBase._union._8_8_ = in_stack_fffffffffffff990;
  scriptPubKeyIn_00.super_CScriptBase._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffff988;
  scriptPubKeyIn_00.super_CScriptBase._union._16_8_ = in_stack_fffffffffffff998;
  scriptPubKeyIn_00.super_CScriptBase._24_8_ = in_stack_fffffffffffff9a0;
  CTxOut::CTxOut((CTxOut *)&block_filter,(CAmount *)&block_filter2,scriptPubKeyIn_00);
  default_ctor_block_filter_1.m_filter_type = 0x10;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\'';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  default_ctor_block_filter_2.m_filter_type = BASIC;
  std::vector<Coin,std::allocator<Coin>>::emplace_back<CTxOut,int,bool>
            ((vector<Coin,std::allocator<Coin>> *)(pCVar12 + -1),(CTxOut *)&block_filter,
             (int *)&default_ctor_block_filter_1,(bool *)&default_ctor_block_filter_2);
  if (0x1c < (uint)block_filter._36_4_) {
    free((void *)block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems._7_8_);
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  }
  if (0x1c < local_1ec) {
    free(local_208.indirect_contents.indirect);
    local_208.indirect_contents.indirect = (char *)0x0;
  }
  pCVar12 = block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
            super__Vector_impl_data._M_finish;
  block_filter2.m_filter_type = 0xbc;
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\x02';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_228.indirect_contents,
             &excluded_scripts[3].super_CScriptBase);
  scriptPubKeyIn_01.super_CScriptBase._union._8_8_ = in_stack_fffffffffffff990;
  scriptPubKeyIn_01.super_CScriptBase._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffff988;
  scriptPubKeyIn_01.super_CScriptBase._union._16_8_ = in_stack_fffffffffffff998;
  scriptPubKeyIn_01.super_CScriptBase._24_8_ = in_stack_fffffffffffff9a0;
  CTxOut::CTxOut((CTxOut *)&block_filter,(CAmount *)&block_filter2,scriptPubKeyIn_01);
  default_ctor_block_filter_1.m_filter_type = 0xa0;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = 0x86;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\x01';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  default_ctor_block_filter_2.m_filter_type = BASIC;
  std::vector<Coin,std::allocator<Coin>>::emplace_back<CTxOut,int,bool>
            ((vector<Coin,std::allocator<Coin>> *)(pCVar12 + -1),(CTxOut *)&block_filter,
             (int *)&default_ctor_block_filter_1,(bool *)&default_ctor_block_filter_2);
  if (0x1c < (uint)block_filter._36_4_) {
    free((void *)block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems._7_8_);
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  }
  if (0x1c < local_20c) {
    free(local_228.indirect_contents.indirect);
    local_228.indirect_contents.indirect = (char *)0x0;
  }
  BlockFilter::BlockFilter(&block_filter,BASIC,&block,&block_undo);
  lVar34 = 0;
  do {
    local_4f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
    ;
    local_4f0 = "";
    local_508 = &boost::unit_test::basic_cstring<char_const>::null;
    local_500 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x6a;
    file.m_begin = (iterator)&local_4f8;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_508,msg);
    uVar22 = *(uint *)((long)&included_scripts[0].super_CScriptBase._size + lVar34);
    if (uVar22 < 0x1d) {
      cVar31.ptr = (uchar *)((long)&included_scripts[0].super_CScriptBase._union + lVar34);
    }
    else {
      cVar31.ptr = *(uchar **)((long)&included_scripts[0].super_CScriptBase._union + lVar34);
      uVar22 = uVar22 - 0x1d;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&default_ctor_block_filter_2,
               cVar31,(const_iterator)(cVar31.ptr + (int)uVar22),(allocator_type *)&local_450);
    _cVar40 = 0x2ec6de;
    default_ctor_block_filter_1.m_filter_type =
         GCSFilter::Match(&block_filter.m_filter,(Element *)&default_ctor_block_filter_2);
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_428._8_8_ = "";
    local_428._0_8_ = (_func_int **)0xe8fec4;
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    block_filter2.m_filter_type = 0xf0;
    builtin_memcpy(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems,"==\x01",4);
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '8';
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = 0x81;
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '>';
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\x01';
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)local_428;
    uVar13 = block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x17];
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
         (uchar)((ulong)local_428 >> 8);
    uVar14 = block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x18];
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
         (uchar)((ulong)local_428 >> 0x10);
    uVar15 = block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x19];
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
         (uchar)((ulong)local_428 >> 0x18);
    uVar16 = block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
         (uchar)((ulong)local_428 >> 0x20);
    uVar17 = block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
         (uchar)((ulong)local_428 >> 0x28);
    uVar18 = block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
         (uchar)((ulong)local_428 >> 0x30);
    uVar19 = block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
         (uchar)((ulong)local_428 >> 0x38);
    uVar20 = block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
    local_518 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
    ;
    local_510 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&default_ctor_block_filter_1,(lazy_ostream *)&block_filter2,1,0,
               WARN,_cVar40,(size_t)&local_518,0x6a);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               (default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems + 0xf
               ));
    pvVar5 = (void *)CONCAT17(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data.
                              _M_elems[6],
                              CONCAT16(default_ctor_block_filter_2.m_block_hash.
                                       super_base_blob<256U>.m_data._M_elems[5],
                                       CONCAT15(default_ctor_block_filter_2.m_block_hash.
                                                super_base_blob<256U>.m_data._M_elems[4],
                                                CONCAT14(default_ctor_block_filter_2.m_block_hash.
                                                         super_base_blob<256U>.m_data._M_elems[3],
                                                         CONCAT13(default_ctor_block_filter_2.
                                                                  m_block_hash.super_base_blob<256U>
                                                                  .m_data._M_elems[2],
                                                                  CONCAT12(
                                                  default_ctor_block_filter_2.m_block_hash.
                                                  super_base_blob<256U>.m_data._M_elems[1],
                                                  CONCAT11(default_ctor_block_filter_2.m_block_hash.
                                                           super_base_blob<256U>.m_data._M_elems[0],
                                                           default_ctor_block_filter_2.m_filter_type
                                                          )))))));
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,CONCAT17(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>
                                      .m_data._M_elems[0x16],
                                      CONCAT16(default_ctor_block_filter_2.m_block_hash.
                                               super_base_blob<256U>.m_data._M_elems[0x15],
                                               CONCAT15(default_ctor_block_filter_2.m_block_hash.
                                                        super_base_blob<256U>.m_data._M_elems[0x14],
                                                        CONCAT14(default_ctor_block_filter_2.
                                                                 m_block_hash.super_base_blob<256U>.
                                                                 m_data._M_elems[0x13],
                                                                 CONCAT13(
                                                  default_ctor_block_filter_2.m_block_hash.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT12(default_ctor_block_filter_2.m_block_hash.
                                                           super_base_blob<256U>.m_data._M_elems
                                                           [0x11],CONCAT11(
                                                  default_ctor_block_filter_2.m_block_hash.
                                                  super_base_blob<256U>.m_data._M_elems[0x10],
                                                  default_ctor_block_filter_2.m_block_hash.
                                                  super_base_blob<256U>.m_data._M_elems[0xf])))))))
                             - (long)pvVar5);
    }
    lVar34 = lVar34 + 0x20;
  } while (lVar34 != 0xa0);
  lVar34 = 0;
  do {
    local_528 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
    ;
    local_520 = "";
    local_538 = &boost::unit_test::basic_cstring<char_const>::null;
    local_530 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x6d;
    file_00.m_begin = (iterator)&local_528;
    msg_00.m_end = in_R9;
    msg_00.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_538,
               msg_00);
    uVar22 = *(uint *)((long)&excluded_scripts[0].super_CScriptBase._size + lVar34);
    if (uVar22 < 0x1d) {
      cVar31.ptr = (uchar *)((long)&excluded_scripts[0].super_CScriptBase._union + lVar34);
    }
    else {
      cVar31.ptr = *(uchar **)((long)&excluded_scripts[0].super_CScriptBase._union + lVar34);
      uVar22 = uVar22 - 0x1d;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&default_ctor_block_filter_2,
               cVar31,(const_iterator)(cVar31.ptr + (int)uVar22),(allocator_type *)&local_450);
    _cVar40 = 0x2ec865;
    bVar21 = GCSFilter::Match(&block_filter.m_filter,(Element *)&default_ctor_block_filter_2);
    default_ctor_block_filter_1.m_filter_type = !bVar21;
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_428._8_8_ = "";
    local_428._0_8_ = "!filter.Match(GCSFilter::Element(script.begin(), script.end()))";
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    block_filter2.m_filter_type = 0xf0;
    builtin_memcpy(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems,"==\x01",4);
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '8';
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = 0x81;
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '>';
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\x01';
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_548 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
    ;
    local_540 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = uVar13;
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = uVar14;
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] = uVar15;
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = uVar16;
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = uVar17;
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = uVar18;
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = uVar19;
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = uVar20;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&default_ctor_block_filter_1,(lazy_ostream *)&block_filter2,1,0,
               WARN,_cVar40,(size_t)&local_548,0x6d);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               (default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems + 0xf
               ));
    pvVar5 = (void *)CONCAT17(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data.
                              _M_elems[6],
                              CONCAT16(default_ctor_block_filter_2.m_block_hash.
                                       super_base_blob<256U>.m_data._M_elems[5],
                                       CONCAT15(default_ctor_block_filter_2.m_block_hash.
                                                super_base_blob<256U>.m_data._M_elems[4],
                                                CONCAT14(default_ctor_block_filter_2.m_block_hash.
                                                         super_base_blob<256U>.m_data._M_elems[3],
                                                         CONCAT13(default_ctor_block_filter_2.
                                                                  m_block_hash.super_base_blob<256U>
                                                                  .m_data._M_elems[2],
                                                                  CONCAT12(
                                                  default_ctor_block_filter_2.m_block_hash.
                                                  super_base_blob<256U>.m_data._M_elems[1],
                                                  CONCAT11(default_ctor_block_filter_2.m_block_hash.
                                                           super_base_blob<256U>.m_data._M_elems[0],
                                                           default_ctor_block_filter_2.m_filter_type
                                                          )))))));
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,CONCAT17(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>
                                      .m_data._M_elems[0x16],
                                      CONCAT16(default_ctor_block_filter_2.m_block_hash.
                                               super_base_blob<256U>.m_data._M_elems[0x15],
                                               CONCAT15(default_ctor_block_filter_2.m_block_hash.
                                                        super_base_blob<256U>.m_data._M_elems[0x14],
                                                        CONCAT14(default_ctor_block_filter_2.
                                                                 m_block_hash.super_base_blob<256U>.
                                                                 m_data._M_elems[0x13],
                                                                 CONCAT13(
                                                  default_ctor_block_filter_2.m_block_hash.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT12(default_ctor_block_filter_2.m_block_hash.
                                                           super_base_blob<256U>.m_data._M_elems
                                                           [0x11],CONCAT11(
                                                  default_ctor_block_filter_2.m_block_hash.
                                                  super_base_blob<256U>.m_data._M_elems[0x10],
                                                  default_ctor_block_filter_2.m_block_hash.
                                                  super_base_blob<256U>.m_data._M_elems[0xf])))))))
                             - (long)pvVar5);
    }
    lVar34 = lVar34 + 0x20;
  } while (lVar34 != 0x80);
  block_filter2.m_filter_type = INVALID;
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  default_ctor_block_filter_1.m_filter_type = BASIC;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems._15_4_ =
       default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems._15_4_ &
       0xffffff00;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  GCSFilter::GCSFilter(&block_filter2.m_filter,(Params *)&default_ctor_block_filter_1);
  local_568._16_16_ = (undefined1  [16])0x0;
  local_568._0_16_ = (undefined1  [16])0x0;
  BlockFilter::Serialize<DataStream>(&block_filter,(DataStream *)local_568);
  BlockFilter::Unserialize<DataStream>(&block_filter2,(DataStream *)local_568);
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x77;
  file_01.m_begin = (iterator)&local_578;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_588,
             msg_01);
  local_428[8] = 0;
  local_428._0_8_ = &PTR__lazy_ostream_013d3cb0;
  stack0xfffffffffffffbe8 = boost::unit_test::lazy_ostream::inst;
  local_410 = (lazy_ostream *)0xf98c4c;
  local_3f0._0_8_ = local_430;
  local_430[0] = block_filter.m_filter_type;
  local_400 = (uint256 *)local_458;
  local_458[0] = block_filter2.m_filter_type;
  local_450.m_message.px = (element_type *)0x0;
  local_450.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_618._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_618._8_8_ = "";
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  default_ctor_block_filter_1.m_filter_type = 0xe0;
  builtin_memcpy(default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems,
                 "J=\x01",4);
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '8';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = 0x81;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '>';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\x01';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  default_ctor_block_filter_2.m_filter_type = 0xe0;
  builtin_memcpy(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems,
                 "J=\x01",4);
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '8';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = 0x81;
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '>';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\x01';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
       (uchar)((ulong)&local_400 >> 8);
  uVar13 = default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x18];
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
       (uchar)((ulong)&local_400 >> 0x10);
  uVar14 = default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x19];
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
       (uchar)((ulong)&local_400 >> 0x18);
  uVar15 = default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
       (uchar)((ulong)&local_400 >> 0x20);
  uVar16 = default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
       (uchar)((ulong)&local_400 >> 0x28);
  uVar17 = default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
       (uchar)((ulong)&local_400 >> 0x30);
  uVar18 = default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
       (uchar)((ulong)&local_400 >> 0x38);
  uVar19 = default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
  pvVar32 = (iterator)0x1;
  pvVar33 = (iterator)0x2;
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems._23_8_ = &local_3f0
  ;
  local_450.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(block_filter.m_filter_type == block_filter2.m_filter_type);
  boost::test_tools::tt_detail::report_assertion
            (&local_450,(lazy_ostream *)local_428,1,2,REQUIRE,0xe8ff03,(size_t)local_618,0x77,
             &default_ctor_block_filter_1,"block_filter2.GetFilterType()",
             &default_ctor_block_filter_2);
  boost::detail::shared_count::~shared_count(&local_450.m_message.pn);
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x78;
  file_02.m_begin = (iterator)&local_598;
  msg_02.m_end = pvVar33;
  msg_02.m_begin = pvVar32;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_5a8,
             msg_02);
  local_400 = &block_filter2.m_block_hash;
  local_428[8] = 0;
  local_428._0_8_ = &PTR__lazy_ostream_013d3cb0;
  stack0xfffffffffffffbe8 = boost::unit_test::lazy_ostream::inst;
  local_410 = (lazy_ostream *)0xf98c4c;
  local_3f0._0_8_ = &block_filter.m_block_hash;
  auVar38[0] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] ==
                block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0]);
  auVar38[1] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] ==
                block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[1]);
  auVar38[2] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] ==
                block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[2]);
  auVar38[3] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] ==
                block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[3]);
  auVar38[4] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] ==
                block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[4]);
  auVar38[5] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] ==
                block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[5]);
  auVar38[6] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] ==
                block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[6]);
  auVar38[7] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] ==
                block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[7]);
  auVar38[8] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] ==
                block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[8]);
  auVar38[9] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] ==
                block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[9]);
  auVar38[10] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] ==
                 block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[10]);
  auVar38[0xb] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar38[0xc] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar38[0xd] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar38[0xe] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar38[0xf] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar36[0] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] ==
                block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar36[1] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] ==
                block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar36[2] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] ==
                block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar36[3] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] ==
                block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar36[4] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] ==
                block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar36[5] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] ==
                block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar36[6] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] ==
                block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar36[7] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] ==
                block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar36[8] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] ==
                block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar36[9] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] ==
                block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar36[10] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar36[0xb] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar36[0xc] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar36[0xd] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar36[0xe] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar36[0xf] = -(block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar36 = auVar36 & auVar38;
  local_450.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) | (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar36[0xf] >> 7) << 0xf) == 0xffff);
  local_450.m_message.px = (element_type *)0x0;
  local_450.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_618._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_618._8_8_ = "";
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  default_ctor_block_filter_1.m_filter_type = 0x88;
  builtin_memcpy(default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems,
                 "I=\x01",4);
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '8';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = 0x81;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '>';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\x01';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  default_ctor_block_filter_2.m_filter_type = 0x88;
  builtin_memcpy(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems,
                 "I=\x01",4);
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '8';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = 0x81;
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '>';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\x01';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  pvVar32 = (iterator)0x1;
  pvVar33 = (iterator)0x2;
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = uVar13;
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] = uVar14;
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = uVar15;
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = uVar16;
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = uVar17;
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = uVar18;
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = uVar19;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems._23_8_ = &local_3f0
  ;
  boost::test_tools::tt_detail::report_assertion
            (&local_450,(lazy_ostream *)local_428,1,2,REQUIRE,0xe8ff3e,(size_t)local_618,0x78,
             &default_ctor_block_filter_1,"block_filter2.GetBlockHash()",
             &default_ctor_block_filter_2);
  boost::detail::shared_count::~shared_count(&local_450.m_message.pn);
  local_5b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar40 = 0x2eccb2;
  file_03.m_end = (iterator)0x79;
  file_03.m_begin = (iterator)&local_5b8;
  msg_03.m_end = pvVar33;
  msg_03.m_begin = pvVar32;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_5c8,
             msg_03);
  if ((long)block_filter.m_filter.m_encoded.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)block_filter.m_filter.m_encoded.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)block_filter2.m_filter.m_encoded.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)block_filter2.m_filter.m_encoded.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (block_filter.m_filter.m_encoded.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        block_filter.m_filter.m_encoded.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      default_ctor_block_filter_2.m_filter_type = true;
    }
    else {
      _cVar40 = 0x2eccfd;
      iVar23 = bcmp(block_filter.m_filter.m_encoded.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    block_filter2.m_filter.m_encoded.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)block_filter.m_filter.m_encoded.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)block_filter.m_filter.m_encoded.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
      default_ctor_block_filter_2.m_filter_type = iVar23 == 0;
    }
  }
  else {
    default_ctor_block_filter_2.m_filter_type = false;
  }
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_428._8_8_ = "";
  local_428._0_8_ = "block_filter.GetEncodedFilter() == block_filter2.GetEncodedFilter()";
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  default_ctor_block_filter_1.m_filter_type = 0xf0;
  builtin_memcpy(default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems,
                 "==\x01",4);
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '8';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = 0x81;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '>';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\x01';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_5d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_5d0 = "";
  pvVar32 = (iterator)0x1;
  pvVar33 = (iterator)0x0;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems._23_8_ =
       (lazy_ostream *)local_428;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&default_ctor_block_filter_2,
             (lazy_ostream *)&default_ctor_block_filter_1,1,0,WARN,_cVar40,(size_t)&local_5d8,0x79);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems + 0xf))
  ;
  default_ctor_block_filter_1.m_filter_type = INVALID;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  default_ctor_block_filter_2.m_filter_type = BASIC;
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  GCSFilter::GCSFilter(&default_ctor_block_filter_1.m_filter,(Params *)&default_ctor_block_filter_2)
  ;
  default_ctor_block_filter_2.m_filter_type = INVALID;
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_428._0_8_ = (_func_int **)0x0;
  local_428[8] = false;
  local_428._9_7_ = 0;
  local_428._16_4_ = (uint)stack0xfffffffffffffbe8 & 0xffffff00;
  uStack_414 = 1;
  GCSFilter::GCSFilter(&default_ctor_block_filter_2.m_filter,(Params *)local_428);
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x7d;
  file_04.m_begin = (iterator)&local_5e8;
  msg_04.m_end = pvVar33;
  msg_04.m_begin = pvVar32;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_5f8,
             msg_04);
  local_618._8_8_ = local_618._8_8_ & 0xffffffffffffff00;
  local_618._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_608 = boost::unit_test::lazy_ostream::inst;
  local_600 = "";
  local_430 = (undefined1  [8])&local_619;
  local_619 = default_ctor_block_filter_1.m_filter_type;
  local_458 = (undefined1  [8])&local_61a;
  local_61a = default_ctor_block_filter_2.m_filter_type;
  local_3f0.m_message.px = (element_type *)0x0;
  local_3f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_400 = (uint256 *)0xe8fd7b;
  local_3f8 = "";
  local_428[8] = 0;
  local_428._0_8_ = &PTR__lazy_ostream_013d4ae0;
  stack0xfffffffffffffbe8 = boost::unit_test::lazy_ostream::inst;
  local_450.m_message.px = (element_type *)(local_450.m_message._1_8_ << 8);
  local_450._0_8_ = &PTR__lazy_ostream_013d4ae0;
  local_450.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_438 = local_458;
  pvVar32 = (iterator)0x1;
  pvVar33 = (iterator)0x2;
  local_410 = (lazy_ostream *)local_430;
  local_3f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (default_ctor_block_filter_1.m_filter_type == default_ctor_block_filter_2.m_filter_type);
  boost::test_tools::tt_detail::report_assertion
            (&local_3f0,(lazy_ostream *)local_618,1,2,REQUIRE,0xe8ffbb,(size_t)&local_400,0x7d,
             (Params *)local_428,"default_ctor_block_filter_2.GetFilterType()",&local_450);
  boost::detail::shared_count::~shared_count(&local_3f0.m_message.pn);
  local_630 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_628 = "";
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x7e;
  file_05.m_begin = (iterator)&local_630;
  msg_05.m_end = pvVar33;
  msg_05.m_begin = pvVar32;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_640,
             msg_05);
  local_430 = (undefined1  [8])&default_ctor_block_filter_1.m_block_hash;
  local_458 = (undefined1  [8])&default_ctor_block_filter_2.m_block_hash;
  local_618._8_8_ = local_618._8_8_ & 0xffffffffffffff00;
  local_618._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_608 = boost::unit_test::lazy_ostream::inst;
  auVar39[0] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0]
                == default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0]
                );
  auVar39[1] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[1]
                == default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[1]
                );
  auVar39[2] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[2]
                == default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[2]
                );
  auVar39[3] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[3]
                == default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[3]
                );
  auVar39[4] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[4]
                == default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[4]
                );
  auVar39[5] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[5]
                == default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[5]
                );
  auVar39[6] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[6]
                == default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[6]
                );
  auVar39[7] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[7]
                == default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[7]
                );
  auVar39[8] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[8]
                == default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[8]
                );
  auVar39[9] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[9]
                == default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[9]
                );
  auVar39[10] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[10]
                 == default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems
                    [10]);
  auVar39[0xb] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                   [0xb] == default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data.
                            _M_elems[0xb]);
  auVar39[0xc] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                   [0xc] == default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data.
                            _M_elems[0xc]);
  auVar39[0xd] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                   [0xd] == default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data.
                            _M_elems[0xd]);
  auVar39[0xe] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                   [0xe] == default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data.
                            _M_elems[0xe]);
  auVar39[0xf] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                   [0xf] == default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data.
                            _M_elems[0xf]);
  auVar37[0] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                 [0x10] ==
                default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10]
                );
  auVar37[1] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                 [0x11] ==
                default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11]
                );
  auVar37[2] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                 [0x12] ==
                default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12]
                );
  auVar37[3] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                 [0x13] ==
                default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13]
                );
  auVar37[4] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                 [0x14] ==
                default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14]
                );
  auVar37[5] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                 [0x15] ==
                default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15]
                );
  auVar37[6] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                 [0x16] ==
                default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16]
                );
  auVar37[7] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                 [0x17] ==
                default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x17]
                );
  auVar37[8] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                 [0x18] ==
                default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x18]
                );
  auVar37[9] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                 [0x19] ==
                default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x19]
                );
  auVar37[10] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                  [0x1a] ==
                 default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems
                 [0x1a]);
  auVar37[0xb] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                   [0x1b] ==
                  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems
                  [0x1b]);
  auVar37[0xc] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                   [0x1c] ==
                  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems
                  [0x1c]);
  auVar37[0xd] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                   [0x1d] ==
                  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems
                  [0x1d]);
  auVar37[0xe] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                   [0x1e] ==
                  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems
                  [0x1e]);
  auVar37[0xf] = -(default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems
                   [0x1f] ==
                  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems
                  [0x1f]);
  auVar37 = auVar37 & auVar39;
  local_3f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) | (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar37[0xf] >> 7) << 0xf) == 0xffff);
  local_600 = "";
  local_3f0.m_message.px = (element_type *)0x0;
  local_3f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_400 = (uint256 *)0xe8fd7b;
  local_3f8 = "";
  local_428[8] = 0;
  local_428._0_8_ = &PTR__lazy_ostream_013d4988;
  stack0xfffffffffffffbe8 = boost::unit_test::lazy_ostream::inst;
  local_450.m_message.px = (element_type *)(local_450.m_message._1_8_ << 8);
  local_450._0_8_ = &PTR__lazy_ostream_013d4988;
  local_450.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_438 = local_458;
  pvVar32 = (iterator)0x1;
  pvVar33 = (iterator)0x2;
  local_410 = (lazy_ostream *)local_430;
  boost::test_tools::tt_detail::report_assertion
            (&local_3f0,(lazy_ostream *)local_618,1,2,REQUIRE,0xe90013,(size_t)&local_400,0x7e,
             (Params *)local_428,"default_ctor_block_filter_2.GetBlockHash()",&local_450);
  boost::detail::shared_count::~shared_count(&local_3f0.m_message.pn);
  local_650 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_648 = "";
  _cVar40 = 0x2ed102;
  file_06.m_end = (iterator)0x7f;
  file_06.m_begin = (iterator)&local_650;
  msg_06.m_end = pvVar33;
  msg_06.m_begin = pvVar32;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
             (size_t)&stack0xfffffffffffff9a0,msg_06);
  if ((long)default_ctor_block_filter_1.m_filter.m_encoded.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)default_ctor_block_filter_1.m_filter.m_encoded.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)default_ctor_block_filter_2.m_filter.m_encoded.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)default_ctor_block_filter_2.m_filter.m_encoded.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (default_ctor_block_filter_1.m_filter.m_encoded.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        default_ctor_block_filter_1.m_filter.m_encoded.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      rVar35.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      _cVar40 = 0x2ed142;
      iVar23 = bcmp(default_ctor_block_filter_1.m_filter.m_encoded.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    default_ctor_block_filter_2.m_filter.m_encoded.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)default_ctor_block_filter_1.m_filter.m_encoded.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)default_ctor_block_filter_1.m_filter.m_encoded.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
      rVar35.super_class_property<bool>.value = (class_property<bool>)(iVar23 == 0);
    }
  }
  else {
    rVar35.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_450.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar35.super_class_property<bool>.value;
  local_450.m_message.px = (element_type *)0x0;
  local_450.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_618._0_8_ =
       "default_ctor_block_filter_1.GetEncodedFilter() == default_ctor_block_filter_2.GetEncodedFilter()"
  ;
  local_618._8_8_ = "";
  local_428[8] = 0;
  local_428._0_8_ = &PTR__lazy_ostream_013d3df0;
  stack0xfffffffffffffbe8 = boost::unit_test::lazy_ostream::inst;
  local_410 = (lazy_ostream *)local_618;
  boost::test_tools::tt_detail::report_assertion
            (&local_450,(lazy_ostream *)local_428,1,0,WARN,_cVar40,(size_t)&stack0xfffffffffffff990,
             0x7f);
  boost::detail::shared_count::~shared_count(&local_450.m_message.pn);
  if (default_ctor_block_filter_2.m_filter.m_encoded.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(default_ctor_block_filter_2.m_filter.m_encoded.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)default_ctor_block_filter_2.m_filter.m_encoded.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)default_ctor_block_filter_2.m_filter.m_encoded.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (default_ctor_block_filter_1.m_filter.m_encoded.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(default_ctor_block_filter_1.m_filter.m_encoded.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)default_ctor_block_filter_1.m_filter.m_encoded.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)default_ctor_block_filter_1.m_filter.m_encoded.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_568);
  if (block_filter2.m_filter.m_encoded.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(block_filter2.m_filter.m_encoded.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)block_filter2.m_filter.m_encoded.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)block_filter2.m_filter.m_encoded.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (block_filter.m_filter.m_encoded.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(block_filter.m_filter.m_encoded.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)block_filter.m_filter.m_encoded.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)block_filter.m_filter.m_encoded.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&block_undo.vtxundo);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block.vtx);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx_2.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx_2.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx_1.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx_1.vin);
  lVar34 = 0x60;
  do {
    if (0x1c < *(uint *)((long)&excluded_scripts[0].super_CScriptBase._size + lVar34)) {
      free(*(void **)((long)&excluded_scripts[0].super_CScriptBase._union + lVar34));
      *(undefined8 *)((long)&excluded_scripts[0].super_CScriptBase._union + lVar34) = 0;
    }
    lVar34 = lVar34 + -0x20;
  } while (lVar34 != -0x20);
  lVar34 = 0x80;
  do {
    if (0x1c < *(uint *)((long)&included_scripts[0].super_CScriptBase._size + lVar34)) {
      free(*(void **)((long)&included_scripts[0].super_CScriptBase._union + lVar34));
      *(undefined8 *)((long)&included_scripts[0].super_CScriptBase._union + lVar34) = 0;
    }
    lVar34 = lVar34 + -0x20;
  } while (lVar34 != -0x20);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(blockfilter_basic_test)
{
    CScript included_scripts[5], excluded_scripts[4];

    // First two are outputs on a single transaction.
    included_scripts[0] << std::vector<unsigned char>(0, 65) << OP_CHECKSIG;
    included_scripts[1] << OP_DUP << OP_HASH160 << std::vector<unsigned char>(1, 20) << OP_EQUALVERIFY << OP_CHECKSIG;

    // Third is an output on in a second transaction.
    included_scripts[2] << OP_1 << std::vector<unsigned char>(2, 33) << OP_1 << OP_CHECKMULTISIG;

    // Last two are spent by a single transaction.
    included_scripts[3] << OP_0 << std::vector<unsigned char>(3, 32);
    included_scripts[4] << OP_4 << OP_ADD << OP_8 << OP_EQUAL;

    // OP_RETURN output is an output on the second transaction.
    excluded_scripts[0] << OP_RETURN << std::vector<unsigned char>(4, 40);

    // This script is not related to the block at all.
    excluded_scripts[1] << std::vector<unsigned char>(5, 33) << OP_CHECKSIG;

    // OP_RETURN is non-standard since it's not followed by a data push, but is still excluded from
    // filter.
    excluded_scripts[2] << OP_RETURN << OP_4 << OP_ADD << OP_8 << OP_EQUAL;

    CMutableTransaction tx_1;
    tx_1.vout.emplace_back(100, included_scripts[0]);
    tx_1.vout.emplace_back(200, included_scripts[1]);
    tx_1.vout.emplace_back(0, excluded_scripts[0]);

    CMutableTransaction tx_2;
    tx_2.vout.emplace_back(300, included_scripts[2]);
    tx_2.vout.emplace_back(0, excluded_scripts[2]);
    tx_2.vout.emplace_back(400, excluded_scripts[3]); // Script is empty

    CBlock block;
    block.vtx.push_back(MakeTransactionRef(tx_1));
    block.vtx.push_back(MakeTransactionRef(tx_2));

    CBlockUndo block_undo;
    block_undo.vtxundo.emplace_back();
    block_undo.vtxundo.back().vprevout.emplace_back(CTxOut(500, included_scripts[3]), 1000, true);
    block_undo.vtxundo.back().vprevout.emplace_back(CTxOut(600, included_scripts[4]), 10000, false);
    block_undo.vtxundo.back().vprevout.emplace_back(CTxOut(700, excluded_scripts[3]), 100000, false);

    BlockFilter block_filter(BlockFilterType::BASIC, block, block_undo);
    const GCSFilter& filter = block_filter.GetFilter();

    for (const CScript& script : included_scripts) {
        BOOST_CHECK(filter.Match(GCSFilter::Element(script.begin(), script.end())));
    }
    for (const CScript& script : excluded_scripts) {
        BOOST_CHECK(!filter.Match(GCSFilter::Element(script.begin(), script.end())));
    }

    // Test serialization/unserialization.
    BlockFilter block_filter2;

    DataStream stream{};
    stream << block_filter;
    stream >> block_filter2;

    BOOST_CHECK_EQUAL(block_filter.GetFilterType(), block_filter2.GetFilterType());
    BOOST_CHECK_EQUAL(block_filter.GetBlockHash(), block_filter2.GetBlockHash());
    BOOST_CHECK(block_filter.GetEncodedFilter() == block_filter2.GetEncodedFilter());

    BlockFilter default_ctor_block_filter_1;
    BlockFilter default_ctor_block_filter_2;
    BOOST_CHECK_EQUAL(default_ctor_block_filter_1.GetFilterType(), default_ctor_block_filter_2.GetFilterType());
    BOOST_CHECK_EQUAL(default_ctor_block_filter_1.GetBlockHash(), default_ctor_block_filter_2.GetBlockHash());
    BOOST_CHECK(default_ctor_block_filter_1.GetEncodedFilter() == default_ctor_block_filter_2.GetEncodedFilter());
}